

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVector<unsigned_long,_2U>::SmallVector
          (SmallVector<unsigned_long,_2U> *this,SmallVector<unsigned_long,_2U> *RHS)

{
  (this->super_SmallVectorImpl<unsigned_long>).super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX =
       &this->super_SmallVectorStorage<unsigned_long,_2U>;
  (this->super_SmallVectorImpl<unsigned_long>).super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  (this->super_SmallVectorImpl<unsigned_long>).super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity = 2;
  if ((RHS->super_SmallVectorImpl<unsigned_long>).super_SmallVectorTemplateBase<unsigned_long,_true>
      .super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size != 0) {
    SmallVectorImpl<unsigned_long>::operator=
              (&this->super_SmallVectorImpl<unsigned_long>,
               &RHS->super_SmallVectorImpl<unsigned_long>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }